

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SWAP.hpp
# Opt level: O3

SquareMatrix<std::complex<float>_> __thiscall
qclab::qgates::SWAP<std::complex<float>_>::matrix(SWAP<std::complex<float>_> *this)

{
  undefined8 *puVar1;
  data_type extraout_RDX;
  SquareMatrix<std::complex<float>_> SVar2;
  
  (this->super_QGate2<std::complex<float>_>).super_QObject<std::complex<float>_>._vptr_QObject =
       (_func_int **)0x4;
  puVar1 = (undefined8 *)operator_new__(0x80);
  *(undefined8 **)(this->qubits_)._M_elems = puVar1;
  *puVar1 = 0x3f800000;
  puVar1[5] = 0;
  puVar1[3] = 0;
  puVar1[4] = 0;
  puVar1[1] = 0;
  puVar1[2] = 0;
  *(undefined4 *)(puVar1 + 6) = 0x3f800000;
  *(undefined8 *)((long)puVar1 + 0x34) = 0;
  *(undefined8 *)((long)puVar1 + 0x3c) = 0;
  *(undefined4 *)((long)puVar1 + 0x44) = 0;
  puVar1[9] = 0x3f800000;
  puVar1[0xe] = 0;
  puVar1[0xc] = 0;
  puVar1[0xd] = 0;
  puVar1[10] = 0;
  puVar1[0xb] = 0;
  puVar1[0xf] = 0x3f800000;
  SVar2.data_._M_t.
  super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
  super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
  super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl =
       extraout_RDX._M_t.
       super___uniq_ptr_impl<std::complex<float>,_std::default_delete<std::complex<float>[]>_>._M_t.
       super__Tuple_impl<0UL,_std::complex<float>_*,_std::default_delete<std::complex<float>[]>_>.
       super__Head_base<0UL,_std::complex<float>_*,_false>._M_head_impl;
  SVar2.size_ = (size_type_conflict)this;
  return SVar2;
}

Assistant:

qclab::dense::SquareMatrix< T > matrix() const override {
          return qclab::dense::SquareMatrix< T >( 1 , 0 , 0 , 0 ,
                                                  0 , 0 , 1 , 0 ,
                                                  0 , 1 , 0 , 0 ,
                                                  0 , 0 , 0 , 1 ) ;
        }